

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.c
# Opt level: O0

al_fixed al_fixsqrt(al_fixed x)

{
  al_fixed aVar1;
  undefined8 in_RAX;
  int in_EDI;
  double __x;
  int unaff_retaddr;
  double x_00;
  
  x_00 = (double)CONCAT44((int)((ulong)in_RAX >> 0x20),in_EDI);
  if (in_EDI < 1) {
    if (in_EDI < 0) {
      al_set_errno(unaff_retaddr);
    }
    aVar1 = 0;
  }
  else {
    __x = al_fixtof(in_EDI);
    sqrt(__x);
    aVar1 = al_ftofix(x_00);
  }
  return aVar1;
}

Assistant:

al_fixed al_fixsqrt(al_fixed x)
{
   if (x > 0)
      return al_ftofix(sqrt(al_fixtof(x)));

   if (x < 0)
      al_set_errno(EDOM);

   return 0;
}